

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

Iterator __thiscall
Imf_3_3::IDManifest::ChannelGroupManifest::insert
          (ChannelGroupManifest *this,uint64_t idValue,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *text)

{
  size_type sVar1;
  size_type sVar2;
  undefined8 uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_vector<basic_string<char>_>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffdc8;
  ArgExc *in_stack_fffffffffffffdd0;
  pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  iterator local_1c8;
  undefined1 local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  iterator local_8;
  
  local_20 = in_RDX;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x30));
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (sVar1 != sVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,
                    "mismatch between number of components in manifest and number of components in inserted entry"
                   );
    uVar3 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  __x = &local_1e8;
  std::
  make_pair<unsigned_long&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            (&__x->first,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RDI + 0x90));
  _Var4 = std::
          map<unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          ::
          insert<std::pair<unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),__x);
  local_1c8._M_node = (_Base_ptr)_Var4.first._M_node;
  local_1c0 = _Var4.second;
  Iterator::Iterator((Iterator *)&local_8,&local_1c8);
  std::
  pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair((pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x1c1084);
  return (Iterator)(iterator)local_8._M_node;
}

Assistant:

IDManifest::ChannelGroupManifest::Iterator
IDManifest::ChannelGroupManifest::insert (
    uint64_t idValue, const std::vector<std::string>& text)
{
    if (_components.size () != text.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "mismatch between number of components in manifest and number of components in inserted entry");
    }
    return IDManifest::ChannelGroupManifest::Iterator (
        _table.insert (make_pair (idValue, text)).first);
}